

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters ZVar1;
  void *__dest;
  size_t sVar2;
  ZSTD_CCtx_params local_a8;
  
  ZVar1 = cParams;
  (cdict->matchState).cParams.searchLog = (int)cParams._12_8_;
  (cdict->matchState).cParams.minMatch = (int)((ulong)cParams._12_8_ >> 0x20);
  (cdict->matchState).cParams.targetLength = cParams.targetLength;
  (cdict->matchState).cParams.strategy = cParams.strategy;
  (cdict->matchState).cParams.windowLog = cParams.windowLog;
  (cdict->matchState).cParams.chainLog = cParams.chainLog;
  (cdict->matchState).cParams.hashLog = (int)ZVar1._8_8_;
  (cdict->matchState).cParams.searchLog = (int)((ulong)ZVar1._8_8_ >> 0x20);
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictBuffer = (void *)0x0;
    cdict->dictContent = dictBuffer;
  }
  else {
    __dest = ZSTD_malloc(dictSize,cdict->customMem);
    cdict->dictBuffer = __dest;
    cdict->dictContent = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  (cdict->cBlockState).rep[0] = 1;
  (cdict->cBlockState).rep[1] = 4;
  (cdict->cBlockState).rep[2] = 8;
  (cdict->cBlockState).entropy.huf.repeatMode = HUF_repeat_none;
  (cdict->cBlockState).entropy.fse.offcode_repeatMode = FSE_repeat_none;
  (cdict->cBlockState).entropy.fse.matchlength_repeatMode = FSE_repeat_none;
  (cdict->cBlockState).entropy.fse.litlength_repeatMode = FSE_repeat_none;
  ZSTD_reset_matchState
            (&cdict->matchState,(void *)((long)cdict->workspace + 0x1800),&cParams,ZSTDcrp_continue,
             0);
  local_a8.customMem.customFree = (ZSTD_freeFunction)0x0;
  local_a8.customMem.opaque = (void *)0x0;
  local_a8.ldmParams.hashRateLog = 0;
  local_a8.ldmParams.windowLog = 0;
  local_a8.customMem.customAlloc = (ZSTD_allocFunction)0x0;
  local_a8.ldmParams.enableLdm = 0;
  local_a8.ldmParams.hashLog = 0;
  local_a8.ldmParams.bucketSizeLog = 0;
  local_a8.ldmParams.minMatchLength = 0;
  local_a8.jobSize = 0;
  local_a8.overlapLog = 0;
  local_a8.rsyncable = 0;
  local_a8.forceWindow = 0;
  local_a8.attachDictPref = ZSTD_dictDefaultAttach;
  local_a8.nbWorkers = 0;
  local_a8._60_4_ = 0;
  local_a8.format = ZSTD_f_zstd1;
  local_a8.fParams.noDictIDFlag = 0;
  local_a8.compressionLevel = 3;
  local_a8.fParams.contentSizeFlag = 1;
  local_a8.fParams.checksumFlag = 0;
  local_a8.cParams.windowLog = cParams.windowLog;
  local_a8.cParams.chainLog = cParams.chainLog;
  local_a8.cParams.hashLog = cParams.hashLog;
  local_a8.cParams.searchLog = cParams.searchLog;
  local_a8.cParams.minMatch = cParams.minMatch;
  local_a8.cParams.targetLength = cParams.targetLength;
  local_a8.cParams.strategy = cParams.strategy;
  sVar2 = ZSTD_compress_insertDictionary
                    (&cdict->cBlockState,&cdict->matchState,&local_a8,cdict->dictContent,
                     cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,cdict->workspace);
  if (sVar2 < 0xffffffffffffff89) {
    cdict->dictID = (U32)sVar2;
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_compressionParameters cParams)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(cParams));
    cdict->matchState.cParams = cParams;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictBuffer = NULL;
        cdict->dictContent = dictBuffer;
    } else {
        void* const internalBuffer = ZSTD_malloc(dictSize, cdict->customMem);
        cdict->dictBuffer = internalBuffer;
        cdict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;

    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    {   void* const end = ZSTD_reset_matchState(
                &cdict->matchState,
                (U32*)cdict->workspace + HUF_WORKSPACE_SIZE_U32,
                &cParams, ZSTDcrp_continue, /* forCCtx */ 0);
        assert(end == (char*)cdict->workspace + cdict->workspaceSize);
        (void)end;
    }
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is <= 8 bytes.
     */
    {   ZSTD_CCtx_params params;
        memset(&params, 0, sizeof(params));
        params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        params.cParams = cParams;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, &params,
                    cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->workspace);
            if (ZSTD_isError(dictID)) return dictID;
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}